

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_get.c
# Opt level: O3

void test_get_on_response(nhr_request request,nhr_response response)

{
  unsigned_short uVar1;
  uint uVar2;
  int iVar3;
  char *value;
  void *pvVar4;
  cJSON *pcVar5;
  cJSON *pcVar6;
  cJSON *pcVar7;
  cJSON *pcVar8;
  ulong uVar9;
  bool bVar10;
  
  value = (char *)nhr_response_get_body(response);
  uVar2 = nhr_response_get_body_length(response);
  pvVar4 = nhr_request_get_user_object(request);
  test_get_error = 1;
  printf("\nResponse #%lu:\n");
  if (uVar2 != 0 && value != (char *)0x0) {
    uVar9 = 0;
    do {
      putchar((int)value[uVar9]);
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  if (pvVar4 == (void *)0x0) {
    test_get_working = '\0';
    test_get_error = 10;
    return;
  }
  if (pvVar4 == (void *)0x4) {
    uVar1 = nhr_response_get_status_code(response);
    printf("\nGet status code: %i, need 418",(ulong)uVar1);
    uVar1 = nhr_response_get_status_code(response);
    bVar10 = uVar1 == 0x1a2;
    test_get_error = 0xe;
  }
  else {
    uVar1 = nhr_response_get_status_code(response);
    if (uVar1 != 200) {
      test_get_working = '\0';
      test_get_error = 0xf;
      return;
    }
    if (pvVar4 != (void *)0x5) {
      if (uVar2 == 0 || value == (char *)0x0) {
        test_get_working = '\0';
        test_get_error = 5;
        return;
      }
      pcVar6 = (cJSON *)0x0;
      pcVar5 = cJSON_ParseWithOpts(value,(char **)0x0,0);
      if (pcVar5 == (cJSON *)0x0) {
        bVar10 = false;
        pcVar8 = (cJSON *)0x0;
        pcVar5 = (cJSON *)0x0;
      }
      else {
        pcVar6 = cJSON_GetObjectItem(pcVar5,"args");
        pcVar7 = cJSON_GetObjectItem(pcVar5,"headers");
        if (pcVar6 == (cJSON *)0x0) {
          pcVar8 = (cJSON *)0x0;
        }
        else {
          pcVar8 = cJSON_GetObjectItem(pcVar6,"test_get_param_name1");
        }
        bVar10 = pcVar6 != (cJSON *)0x0 && pcVar7 != (cJSON *)0x0;
        pcVar6 = cJSON_GetObjectItem(pcVar5,"deflated");
        pcVar5 = cJSON_GetObjectItem(pcVar5,"gzipped");
      }
      if (pvVar4 == (void *)0x3) {
        if (pcVar5 == (cJSON *)0x0) {
          test_get_working = '\0';
          test_get_error = 0xc;
          return;
        }
        iVar3 = pcVar5->valueint;
      }
      else {
        if (pvVar4 != (void *)0x2) {
          if (pvVar4 != (void *)0x1) {
            test_get_working = '\0';
            test_get_error = 0xc;
            return;
          }
          if (!(bool)(bVar10 & pcVar8 != (cJSON *)0x0)) {
            test_get_working = '\0';
            test_get_error = 0xc;
            return;
          }
          if (pcVar8->valuestring == (char *)0x0) {
            test_get_working = '\0';
            test_get_error = 0xc;
            return;
          }
          iVar3 = strcmp("test_get_param_value1",pcVar8->valuestring);
          test_get_working = '\0';
          test_get_error = (uint)(iVar3 != 0) * 9;
          return;
        }
        if (pcVar6 == (cJSON *)0x0) {
          test_get_working = '\0';
          test_get_error = 0xc;
          return;
        }
        iVar3 = pcVar6->valueint;
      }
      if (iVar3 == 0) {
        test_get_working = '\0';
        test_get_error = 0xc;
        return;
      }
      test_get_working = '\0';
      test_get_error = 0;
      return;
    }
    printf("\nGet body_len: %u, need 1024",(ulong)uVar2);
    bVar10 = uVar2 == 0x400;
    test_get_error = 0xf;
  }
  if (bVar10) {
    test_get_error = 0;
  }
  test_get_working = '\0';
  return;
}

Assistant:

static void test_get_on_response(nhr_request request, nhr_response response) {
	char * body = nhr_response_get_body(response);
	unsigned int body_len = nhr_response_get_body_length(response);
	unsigned long test_number = (unsigned long)nhr_request_get_user_object(request);

	test_get_error = 1;
	printf("\nResponse #%lu:\n", test_number);
	test_get_log_body(body, body_len);
	if (test_number == 0) {
		test_get_error = 10;
		test_get_working = nhr_false;
		return;
	}

	if (test_number == 4) { // status code 418
		printf("\nGet status code: %i, need 418", (int)nhr_response_get_status_code(response));
		test_get_error = nhr_response_get_status_code(response) == 418 ? 0 : 14;
		test_get_working = nhr_false;
		return;
	}

	if (nhr_response_get_status_code(response) != 200) {
		test_get_error = 15;
		test_get_working = nhr_false;
		return;
	}

	if (test_number == 5) {
		printf("\nGet body_len: %u, need 1024", body_len);
		test_get_error = body_len == 1024 ? 0 : 15;
		test_get_working = nhr_false;
		return;
	}

	if (body && body_len) {
		test_get_error = test_get_parse_body(body, test_number);
	} else {
		test_get_error = 5;
	}

	test_get_working = nhr_false;
}